

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_24939c::Db::parseFunctionType(Db *this)

{
  bool bVar1;
  undefined1 local_e0 [8];
  NodeArray Params;
  Node *T_1;
  StringView local_b8;
  size_t local_a8;
  size_t ParamsBegin;
  Node *pNStack_98;
  FunctionRefQual ReferenceQualifier;
  Node *ReturnType;
  NodeArray local_80;
  Node *local_70;
  Node *T;
  size_t SpecsBegin;
  Node *local_50;
  Node *E;
  StringView local_38;
  NameType *local_28;
  Node *ExceptionSpec;
  Db *pDStack_18;
  Qualifiers CVQuals;
  Db *this_local;
  
  pDStack_18 = this;
  ExceptionSpec._4_4_ = parseCVQualifiers(this);
  local_28 = (NameType *)0x0;
  StringView::StringView(&local_38,"Do");
  bVar1 = consumeIf(this,local_38);
  if (bVar1) {
    local_28 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
                         ((Db *)this,(char (*) [9])"noexcept");
  }
  else {
    StringView::StringView((StringView *)&E,"DO");
    bVar1 = consumeIf(this,_E);
    if (bVar1) {
      local_50 = parseExpr(this);
      if ((local_50 == (Node *)0x0) || (bVar1 = consumeIf(this,'E'), !bVar1)) {
        return (Node *)0x0;
      }
      local_28 = (NameType *)
                 (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::NoexceptSpec,(anonymous_namespace)::Node*&>
                           ((Db *)this,&local_50);
    }
    else {
      StringView::StringView((StringView *)&SpecsBegin,"Dw");
      bVar1 = consumeIf(this,_SpecsBegin);
      if (bVar1) {
        T = (Node *)PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
        while (bVar1 = consumeIf(this,'E'), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_70 = parseType(this);
          if (local_70 == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_70);
        }
        local_80 = popTrailingNodeArray(this,(size_t)T);
        local_28 = (NameType *)
                   (anonymous_namespace)::Db::
                   make<(anonymous_namespace)::DynamicExceptionSpec,(anonymous_namespace)::NodeArray>
                             ((Db *)this,&local_80);
      }
    }
  }
  StringView::StringView((StringView *)&ReturnType,"Dx");
  consumeIf(this,_ReturnType);
  bVar1 = consumeIf(this,'F');
  if (bVar1) {
    consumeIf(this,'Y');
    pNStack_98 = parseType(this);
    if (pNStack_98 == (Node *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      ParamsBegin._7_1_ = 0;
      local_a8 = PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
      while (bVar1 = consumeIf(this,'E'), !bVar1) {
        bVar1 = consumeIf(this,'v');
        if (!bVar1) {
          StringView::StringView(&local_b8,"RE");
          bVar1 = consumeIf(this,local_b8);
          if (bVar1) {
            ParamsBegin._7_1_ = 1;
            break;
          }
          StringView::StringView((StringView *)&T_1,"OE");
          bVar1 = consumeIf(this,_T_1);
          if (bVar1) {
            ParamsBegin._7_1_ = 2;
            break;
          }
          Params.NumElements = (size_t)parseType(this);
          if ((Node *)Params.NumElements == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                    (&this->Names,(Node **)&Params.NumElements);
        }
      }
      _local_e0 = popTrailingNodeArray(this,local_a8);
      this_local = (Db *)(anonymous_namespace)::Db::
                         make<(anonymous_namespace)::FunctionType,(anonymous_namespace)::Node*&,(anonymous_namespace)::NodeArray&,(anonymous_namespace)::Qualifiers&,(anonymous_namespace)::FunctionRefQual&,(anonymous_namespace)::Node*&>
                                   ((Db *)this,&stack0xffffffffffffff68,(NodeArray *)local_e0,
                                    (Qualifiers *)((long)&ExceptionSpec + 4),
                                    (FunctionRefQual *)((long)&ParamsBegin + 7),(Node **)&local_28);
    }
  }
  else {
    this_local = (Db *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseFunctionType() {
  Qualifiers CVQuals = parseCVQualifiers();

  Node *ExceptionSpec = nullptr;
  if (consumeIf("Do")) {
    ExceptionSpec = make<NameType>("noexcept");
  } else if (consumeIf("DO")) {
    Node *E = parseExpr();
    if (E == nullptr || !consumeIf('E'))
      return nullptr;
    ExceptionSpec = make<NoexceptSpec>(E);
  } else if (consumeIf("Dw")) {
    size_t SpecsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *T = parseType();
      if (T == nullptr)
        return nullptr;
      Names.push_back(T);
    }
    ExceptionSpec =
      make<DynamicExceptionSpec>(popTrailingNodeArray(SpecsBegin));
  }

  consumeIf("Dx"); // transaction safe

  if (!consumeIf('F'))
    return nullptr;
  consumeIf('Y'); // extern "C"
  Node *ReturnType = parseType();
  if (ReturnType == nullptr)
    return nullptr;

  FunctionRefQual ReferenceQualifier = FrefQualNone;
  size_t ParamsBegin = Names.size();
  while (true) {
    if (consumeIf('E'))
      break;
    if (consumeIf('v'))
      continue;
    if (consumeIf("RE")) {
      ReferenceQualifier = FrefQualLValue;
      break;
    }
    if (consumeIf("OE")) {
      ReferenceQualifier = FrefQualRValue;
      break;
    }
    Node *T = parseType();
    if (T == nullptr)
      return nullptr;
    Names.push_back(T);
  }

  NodeArray Params = popTrailingNodeArray(ParamsBegin);
  return make<FunctionType>(ReturnType, Params, CVQuals,
                            ReferenceQualifier, ExceptionSpec);
}